

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

void SUNSparseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  undefined8 *puVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  bVar8 = *(int *)((long)A->content + 0x28) == 0;
  pcVar4 = "CSR";
  if (bVar8) {
    pcVar4 = "CSC";
  }
  pcVar3 = "row";
  if (bVar8) {
    pcVar3 = "col";
  }
  fputc(10,(FILE *)outfile);
  puVar1 = (undefined8 *)A->content;
  fprintf((FILE *)outfile,"%ld by %ld %s matrix, NNZ: %ld \n",*puVar1,puVar1[1],pcVar4,puVar1[2]);
  pvVar2 = A->content;
  if (0 < *(long *)((long)pvVar2 + 0x18)) {
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      fprintf((FILE *)outfile,"%s %ld : locations %ld to %ld\n",pcVar3,lVar5,
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x38) + lVar5 * 8),
              *(long *)(*(long *)((long)pvVar2 + 0x38) + 8 + lVar5 * 8) + -1);
      fwrite("  ",2,1,(FILE *)outfile);
      pvVar2 = A->content;
      lVar7 = *(long *)(*(long *)((long)pvVar2 + 0x38) + lVar5 * 8);
      if (lVar7 < *(long *)(*(long *)((long)pvVar2 + 0x38) + 8 + lVar5 * 8)) {
        do {
          fprintf((FILE *)outfile,"%ld: %.16g   ",
                  *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar7 * 8),
                  *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + lVar7 * 8));
          lVar7 = lVar7 + 1;
          pvVar2 = A->content;
        } while (lVar7 < *(long *)(*(long *)((long)pvVar2 + 0x38) + lVar6 * 8));
      }
      fputc(10,(FILE *)outfile);
      pvVar2 = A->content;
      lVar5 = lVar6;
    } while (lVar6 < *(long *)((long)pvVar2 + 0x18));
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNSparseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  char* matrixtype;
  char* indexname;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    indexname  = (char*)"col";
    matrixtype = (char*)"CSC";
  }
  else
  {
    indexname  = (char*)"row";
    matrixtype = (char*)"CSR";
  }
  fprintf(outfile, "\n");
  fprintf(outfile, "%ld by %ld %s matrix, NNZ: %ld \n", (long int)SM_ROWS_S(A),
          (long int)SM_COLUMNS_S(A), matrixtype, (long int)SM_NNZ_S(A));
  for (j = 0; j < SM_NP_S(A); j++)
  {
    fprintf(outfile, "%s %ld : locations %ld to %ld\n", indexname, (long int)j,
            (long int)(SM_INDEXPTRS_S(A))[j],
            (long int)(SM_INDEXPTRS_S(A))[j + 1] - 1);
    fprintf(outfile, "  ");
    for (i = (SM_INDEXPTRS_S(A))[j]; i < (SM_INDEXPTRS_S(A))[j + 1]; i++)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile, "%ld: %.32Lg   ", (long int)(SM_INDEXVALS_S(A))[i],
              (SM_DATA_S(A))[i]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile, "%ld: %.16g   ", (long int)(SM_INDEXVALS_S(A))[i],
              (SM_DATA_S(A))[i]);
#else
      fprintf(outfile, "%ld: %.8g   ", (long int)(SM_INDEXVALS_S(A))[i],
              (SM_DATA_S(A))[i]);
#endif
    }
    fprintf(outfile, "\n");
  }
  fprintf(outfile, "\n");
  return;
}